

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

void __thiscall
soul::ResolutionPass::rebuildVariableUseCounts(soul::AST::ModuleBase&)::UseCounter::visit(soul::AST
::CallOrCast__(void *this,CallOrCast *c)

{
  undefined1 uVar1;
  
  if ((c->super_CallOrCastBase).arguments.object != (CommaSeparatedList *)0x0) {
    uVar1 = *(undefined1 *)((long)this + 9);
    *(undefined1 *)((long)this + 9) = 1;
    (**(code **)(*this + 0x18))();
    (**(code **)(*this + 0x18))(this,(c->nameOrType).object);
    *(undefined1 *)((long)this + 9) = uVar1;
  }
  return;
}

Assistant:

void visit (AST::CallOrCast& c) override
            {
                if (c.arguments != nullptr)
                {
                    // Since we don't know if this might be a function with all pass-by-ref args, we need
                    // to mark all the args as possibly being written..
                    auto oldWriting = isWriting;
                    isWriting = true;
                    ASTVisitor::visit (c);
                    isWriting = oldWriting;
                }
            }